

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O2

string * __thiscall
PvrLegacyHeader::ToString_abi_cxx11_(string *__return_storage_ptr__,PvrLegacyHeader *this)

{
  reference __lhs;
  const_reference __rhs;
  uint uVar1;
  ulong __n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_90);
  ToStringArray_abi_cxx11_(&vStack_a8,this);
  for (uVar1 = 0; __n = (ulong)uVar1,
      __n < (ulong)((long)(PvrLegacyInfo::column_names_abi_cxx11_._8_8_ -
                          PvrLegacyInfo::column_names_abi_cxx11_._0_8_) >> 5); uVar1 = uVar1 + 1) {
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)PvrLegacyInfo::column_names_abi_cxx11_,__n);
    std::operator+(&local_70,__lhs,": ");
    __rhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at(&vStack_a8,__n);
    std::operator+(&local_50,&local_70,__rhs);
    std::operator+(&local_90,&local_50,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_a8);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string ToString() {
    std::string output("");
    const auto& variable_strings(this->ToStringArray());
    for(unsigned int index=0; index<PvrLegacyInfo::column_names.size();++index)
      output.append(PvrLegacyInfo::column_names.at(index) + ": " + variable_strings.at(index) + "\n");
    return output;
  }